

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Timestamp.c
# Opt level: O1

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/farrrb[P]XcpLight/tests/test_Timestamp.c"
            );
  UnityDefaultTestRun(test_TimestampAfterInit,"test_TimestampAfterInit",0x72);
  UnityDefaultTestRun(test_TimestampIncrement,"test_TimestampIncrement",0x73);
  UnityDefaultTestRun(test_TimestampWrapAround,"test_TimestampWrapAround",0x74);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
  UNITY_BEGIN();
  RUN_TEST(test_TimestampAfterInit);
  RUN_TEST(test_TimestampIncrement);
  RUN_TEST(test_TimestampWrapAround);
  //RUN_TEST(test_CmdGetDaqClock);
  return UNITY_END();
}